

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglstreamconvenience.cpp
# Opt level: O0

void __thiscall QEGLStreamConvenience::initialize(QEGLStreamConvenience *this,EGLDisplay dpy)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  char *extensions;
  undefined8 in_stack_ffffffffffffffa0;
  int line;
  QMessageLogger *this_00;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)in_RDI[6].context.category & 1) == 0) {
    this_00 = in_RDI;
    iVar1 = eglBindAPI(0x30a0);
    if (iVar1 == 0) {
      QMessageLogger::QMessageLogger(this_00,in_RSI,line,(char *)in_RDI);
      QMessageLogger::warning(local_28,"Failed to bind OpenGL ES API");
    }
    else {
      pcVar2 = (char *)eglQueryString(in_RSI,0x3055);
      if (pcVar2 == (char *)0x0) {
        QMessageLogger::QMessageLogger(this_00,in_RSI,0,(char *)in_RDI);
        QMessageLogger::warning(local_48,"Failed to query EGL extensions");
      }
      else {
        pcVar3 = (char *)eglGetProcAddress("eglCreateStreamKHR");
        (in_RDI->context).category = pcVar3;
        pcVar3 = (char *)eglGetProcAddress("eglDestroyStreamKHR");
        in_RDI[2].context.file = pcVar3;
        pcVar3 = (char *)eglGetProcAddress("eglStreamAttribKHR");
        in_RDI[2].context.function = pcVar3;
        pcVar3 = (char *)eglGetProcAddress("eglQueryStreamKHR");
        in_RDI[2].context.category = pcVar3;
        uVar4 = eglGetProcAddress("eglQueryStreamu64KHR");
        in_RDI[3].context.version = (int)uVar4;
        in_RDI[3].context.line = (int)((ulong)uVar4 >> 0x20);
        pcVar3 = (char *)eglGetProcAddress("eglCreateStreamProducerSurfaceKHR");
        in_RDI[3].context.file = pcVar3;
        pcVar3 = (char *)eglGetProcAddress("eglStreamConsumerOutputEXT");
        in_RDI[3].context.function = pcVar3;
        pcVar3 = (char *)eglGetProcAddress("eglGetOutputLayersEXT");
        in_RDI[3].context.category = pcVar3;
        uVar4 = eglGetProcAddress("eglGetOutputPortsEXT");
        in_RDI[4].context.version = (int)uVar4;
        in_RDI[4].context.line = (int)((ulong)uVar4 >> 0x20);
        pcVar3 = (char *)eglGetProcAddress("eglOutputLayerAttribEXT");
        in_RDI[4].context.file = pcVar3;
        pcVar3 = (char *)eglGetProcAddress("eglQueryOutputLayerAttribEXT");
        in_RDI[4].context.function = pcVar3;
        pcVar3 = (char *)eglGetProcAddress("eglQueryOutputLayerStringEXT");
        in_RDI[4].context.category = pcVar3;
        uVar4 = eglGetProcAddress("eglQueryOutputPortAttribEXT");
        in_RDI[5].context.version = (int)uVar4;
        in_RDI[5].context.line = (int)((ulong)uVar4 >> 0x20);
        pcVar3 = (char *)eglGetProcAddress("eglQueryOutputPortStringEXT");
        in_RDI[5].context.file = pcVar3;
        pcVar3 = (char *)eglGetProcAddress("eglGetStreamFileDescriptorKHR");
        in_RDI[5].context.function = pcVar3;
        pcVar3 = (char *)eglGetProcAddress("eglCreateStreamFromFileDescriptorKHR");
        in_RDI[5].context.category = pcVar3;
        uVar4 = eglGetProcAddress("eglStreamConsumerGLTextureExternalKHR");
        in_RDI[6].context.version = (int)uVar4;
        in_RDI[6].context.line = (int)((ulong)uVar4 >> 0x20);
        pcVar3 = (char *)eglGetProcAddress("eglStreamConsumerAcquireKHR");
        in_RDI[6].context.file = pcVar3;
        pcVar3 = (char *)eglGetProcAddress("eglStreamConsumerReleaseKHR");
        in_RDI[6].context.function = pcVar3;
        uVar4 = eglGetProcAddress("eglCreateStreamAttribNV");
        in_RDI[1].context.version = (int)uVar4;
        in_RDI[1].context.line = (int)((ulong)uVar4 >> 0x20);
        pcVar3 = (char *)eglGetProcAddress("eglSetStreamAttribNV");
        in_RDI[1].context.file = pcVar3;
        pcVar3 = (char *)eglGetProcAddress("eglQueryStreamAttribNV");
        in_RDI[1].context.function = pcVar3;
        pcVar3 = (char *)eglGetProcAddress("eglStreamConsumerAcquireAttribNV");
        in_RDI[1].context.category = pcVar3;
        uVar4 = eglGetProcAddress("eglStreamConsumerReleaseAttribNV");
        in_RDI[2].context.version = (int)uVar4;
        in_RDI[2].context.line = (int)((ulong)uVar4 >> 0x20);
        pcVar3 = strstr(pcVar2,"EGL_KHR_stream");
        *(bool *)((long)&in_RDI[6].context.category + 3) = pcVar3 != (char *)0x0;
        pcVar3 = strstr(pcVar2,"EGL_KHR_stream_producer_eglsurface");
        *(bool *)((long)&in_RDI[6].context.category + 4) = pcVar3 != (char *)0x0;
        pcVar3 = strstr(pcVar2,"EGL_EXT_stream_consumer_egloutput");
        *(bool *)((long)&in_RDI[6].context.category + 5) = pcVar3 != (char *)0x0;
        pcVar3 = strstr(pcVar2,"EGL_EXT_output_drm");
        *(bool *)((long)&in_RDI[6].context.category + 6) = pcVar3 != (char *)0x0;
        pcVar3 = strstr(pcVar2,"EGL_EXT_output_base");
        *(bool *)((long)&in_RDI[6].context.category + 7) = pcVar3 != (char *)0x0;
        pcVar3 = strstr(pcVar2,"EGL_KHR_stream_cross_process_fd");
        *(bool *)&in_RDI[7].context.version = pcVar3 != (char *)0x0;
        pcVar2 = strstr(pcVar2,"EGL_KHR_stream_consumer_gltexture");
        *(bool *)((long)&in_RDI[7].context.version + 1) = pcVar2 != (char *)0x0;
        *(undefined1 *)&in_RDI[6].context.category = 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEGLStreamConvenience::initialize(EGLDisplay dpy)
{
    if (initialized)
        return;

    if (!eglBindAPI(EGL_OPENGL_ES_API)) {
        qWarning("Failed to bind OpenGL ES API");
        return;
    }

    const char *extensions = eglQueryString(dpy, EGL_EXTENSIONS);
    if (!extensions) {
        qWarning("Failed to query EGL extensions");
        return;
    }

    create_stream = reinterpret_cast<PFNEGLCREATESTREAMKHRPROC>(eglGetProcAddress("eglCreateStreamKHR"));
    destroy_stream = reinterpret_cast<PFNEGLDESTROYSTREAMKHRPROC>(eglGetProcAddress("eglDestroyStreamKHR"));
    stream_attrib = reinterpret_cast<PFNEGLSTREAMATTRIBKHRPROC>(eglGetProcAddress("eglStreamAttribKHR"));
    query_stream = reinterpret_cast<PFNEGLQUERYSTREAMKHRPROC>(eglGetProcAddress("eglQueryStreamKHR"));
    query_stream_u64 = reinterpret_cast<PFNEGLQUERYSTREAMU64KHRPROC>(eglGetProcAddress("eglQueryStreamu64KHR"));
    create_stream_producer_surface = reinterpret_cast<PFNEGLCREATESTREAMPRODUCERSURFACEKHRPROC>(eglGetProcAddress("eglCreateStreamProducerSurfaceKHR"));
    stream_consumer_output = reinterpret_cast<PFNEGLSTREAMCONSUMEROUTPUTEXTPROC>(eglGetProcAddress("eglStreamConsumerOutputEXT"));
    get_output_layers = reinterpret_cast<PFNEGLGETOUTPUTLAYERSEXTPROC>(eglGetProcAddress("eglGetOutputLayersEXT"));
    get_output_ports = reinterpret_cast<PFNEGLGETOUTPUTPORTSEXTPROC>(eglGetProcAddress("eglGetOutputPortsEXT"));
    output_layer_attrib = reinterpret_cast<PFNEGLOUTPUTLAYERATTRIBEXTPROC>(eglGetProcAddress("eglOutputLayerAttribEXT"));
    query_output_layer_attrib = reinterpret_cast<PFNEGLQUERYOUTPUTLAYERATTRIBEXTPROC>(eglGetProcAddress("eglQueryOutputLayerAttribEXT"));
    query_output_layer_string = reinterpret_cast<PFNEGLQUERYOUTPUTLAYERSTRINGEXTPROC>(eglGetProcAddress("eglQueryOutputLayerStringEXT"));
    query_output_port_attrib = reinterpret_cast<PFNEGLQUERYOUTPUTPORTATTRIBEXTPROC>(eglGetProcAddress("eglQueryOutputPortAttribEXT"));
    query_output_port_string = reinterpret_cast<PFNEGLQUERYOUTPUTPORTSTRINGEXTPROC>(eglGetProcAddress("eglQueryOutputPortStringEXT"));
    get_stream_file_descriptor = reinterpret_cast<PFNEGLGETSTREAMFILEDESCRIPTORKHRPROC>(eglGetProcAddress("eglGetStreamFileDescriptorKHR"));
    create_stream_from_file_descriptor = reinterpret_cast<PFNEGLCREATESTREAMFROMFILEDESCRIPTORKHRPROC>(eglGetProcAddress("eglCreateStreamFromFileDescriptorKHR"));
    stream_consumer_gltexture = reinterpret_cast<PFNEGLSTREAMCONSUMERGLTEXTUREEXTERNALKHRPROC>(eglGetProcAddress("eglStreamConsumerGLTextureExternalKHR"));
    stream_consumer_acquire = reinterpret_cast<PFNEGLSTREAMCONSUMERACQUIREKHRPROC>(eglGetProcAddress("eglStreamConsumerAcquireKHR"));
    stream_consumer_release = reinterpret_cast<PFNEGLSTREAMCONSUMERRELEASEKHRPROC>(eglGetProcAddress("eglStreamConsumerReleaseKHR"));
    create_stream_attrib_nv = reinterpret_cast<PFNEGLCREATESTREAMATTRIBNVPROC>(eglGetProcAddress("eglCreateStreamAttribNV"));
    set_stream_attrib_nv = reinterpret_cast<PFNEGLSETSTREAMATTRIBNVPROC>(eglGetProcAddress("eglSetStreamAttribNV"));
    query_stream_attrib_nv = reinterpret_cast<PFNEGLQUERYSTREAMATTRIBNVPROC>(eglGetProcAddress("eglQueryStreamAttribNV"));
    acquire_stream_attrib_nv = reinterpret_cast<PFNEGLSTREAMCONSUMERACQUIREATTRIBNVPROC>(eglGetProcAddress("eglStreamConsumerAcquireAttribNV"));
    release_stream_attrib_nv = reinterpret_cast<PFNEGLSTREAMCONSUMERRELEASEATTRIBNVPROC>(eglGetProcAddress("eglStreamConsumerReleaseAttribNV"));

    has_egl_stream = strstr(extensions, "EGL_KHR_stream");
    has_egl_stream_producer_eglsurface = strstr(extensions, "EGL_KHR_stream_producer_eglsurface");
    has_egl_stream_consumer_egloutput = strstr(extensions, "EGL_EXT_stream_consumer_egloutput");
    has_egl_output_drm = strstr(extensions, "EGL_EXT_output_drm");
    has_egl_output_base = strstr(extensions, "EGL_EXT_output_base");
    has_egl_stream_cross_process_fd = strstr(extensions, "EGL_KHR_stream_cross_process_fd");
    has_egl_stream_consumer_gltexture = strstr(extensions, "EGL_KHR_stream_consumer_gltexture");

    initialized = true;
}